

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_truetype.h
# Opt level: O0

stbtt_int32 stbtt__GetGlyphGPOSInfoAdvance(stbtt_fontinfo *info,int glyph1,int glyph2)

{
  stbtt_uint16 sVar1;
  stbtt_uint16 sVar2;
  stbtt_uint16 sVar3;
  stbtt_uint16 sVar4;
  stbtt_int16 sVar5;
  stbtt_int32 sVar6;
  int iVar7;
  stbtt_int32 sVar8;
  stbtt_uint8 *psVar9;
  stbtt_uint8 *p;
  stbtt_uint8 *psVar10;
  stbtt_int16 xAdvance_1;
  stbtt_uint8 *class2Records;
  stbtt_uint8 *class1Records;
  stbtt_uint16 class2Count;
  stbtt_uint16 class1Count;
  int glyph2class;
  int glyph1class;
  stbtt_uint16 classDef2Offset;
  stbtt_uint16 classDef1Offset;
  stbtt_uint16 valueFormat2_1;
  stbtt_uint16 valueFormat1_1;
  stbtt_int16 xAdvance;
  stbtt_uint8 *pairValue;
  stbtt_uint16 secondGlyph;
  stbtt_uint8 *pairValueArray;
  stbtt_uint16 pairValueCount;
  stbtt_uint8 *pairValueTable;
  stbtt_uint16 pairPosOffset;
  stbtt_uint16 pairSetCount;
  stbtt_int32 valueRecordPairSizeInBytes;
  stbtt_uint16 valueFormat2;
  stbtt_uint16 valueFormat1;
  int needle;
  int straw;
  stbtt_int32 m;
  stbtt_int32 r;
  stbtt_int32 l;
  stbtt_int32 coverageIndex;
  stbtt_uint16 coverageOffset;
  stbtt_uint16 posFormat;
  stbtt_uint8 *table;
  stbtt_uint16 subtableOffset;
  stbtt_uint8 *subTableOffsets;
  stbtt_uint16 subTableCount;
  stbtt_uint16 lookupType;
  stbtt_uint8 *lookupTable;
  int local_48;
  int iStack_44;
  stbtt_uint16 lookupOffset;
  stbtt_int32 sti;
  stbtt_int32 i;
  stbtt_uint8 *data;
  stbtt_uint16 lookupCount;
  stbtt_uint8 *lookupList;
  stbtt_uint16 lookupListOffset;
  int glyph2_local;
  int glyph1_local;
  stbtt_fontinfo *info_local;
  
  if (info->gpos != 0) {
    psVar9 = info->data + info->gpos;
    sVar1 = ttUSHORT(psVar9);
    if ((sVar1 == 1) && (sVar1 = ttUSHORT(psVar9 + 2), sVar1 == 0)) {
      sVar1 = ttUSHORT(psVar9 + 8);
      psVar9 = psVar9 + (int)(uint)sVar1;
      sVar1 = ttUSHORT(psVar9);
      for (iStack_44 = 0; iStack_44 < (int)(uint)sVar1; iStack_44 = iStack_44 + 1) {
        sVar2 = ttUSHORT(psVar9 + (long)(iStack_44 << 1) + 2);
        p = psVar9 + (int)(uint)sVar2;
        sVar2 = ttUSHORT(p);
        sVar3 = ttUSHORT(p + 4);
        if (sVar2 == 2) {
          for (local_48 = 0; local_48 < (int)(uint)sVar3; local_48 = local_48 + 1) {
            sVar2 = ttUSHORT(p + (long)(local_48 << 1) + 6);
            psVar10 = p + (int)(uint)sVar2;
            sVar2 = ttUSHORT(psVar10);
            sVar4 = ttUSHORT(psVar10 + 2);
            sVar6 = stbtt__GetCoverageIndex(psVar10 + (int)(uint)sVar4,glyph1);
            if (sVar6 != -1) {
              if (sVar2 != 1) {
                if (sVar2 != 2) {
                  return 0;
                }
                sVar1 = ttUSHORT(psVar10 + 4);
                sVar2 = ttUSHORT(psVar10 + 6);
                if ((sVar1 != 4) || (sVar2 != 0)) {
                  return 0;
                }
                sVar1 = ttUSHORT(psVar10 + 8);
                sVar2 = ttUSHORT(psVar10 + 10);
                sVar6 = stbtt__GetGlyphClass(psVar10 + (int)(uint)sVar1,glyph1);
                sVar8 = stbtt__GetGlyphClass(psVar10 + (int)(uint)sVar2,glyph2);
                sVar1 = ttUSHORT(psVar10 + 0xc);
                sVar2 = ttUSHORT(psVar10 + 0xe);
                if ((sVar6 < 0) || ((int)(uint)sVar1 <= sVar6)) {
                  return 0;
                }
                if ((-1 < sVar8) && (sVar8 < (int)(uint)sVar2)) {
                  sVar5 = ttSHORT(psVar10 + (long)(sVar8 << 1) +
                                            (long)(int)(sVar6 * (uint)sVar2 * 2) + 0x10);
                  return (int)sVar5;
                }
                return 0;
              }
              sVar2 = ttUSHORT(psVar10 + 4);
              sVar4 = ttUSHORT(psVar10 + 6);
              if ((sVar2 != 4) || (sVar4 != 0)) {
                return 0;
              }
              sVar2 = ttUSHORT(psVar10 + 8);
              sVar4 = ttUSHORT(psVar10 + (long)(sVar6 << 1) + 10);
              psVar10 = psVar10 + (int)(uint)sVar4;
              sVar4 = ttUSHORT(psVar10);
              if ((int)(uint)sVar2 <= sVar6) {
                return 0;
              }
              straw = sVar4 - 1;
              m = 0;
              while (m <= straw) {
                iVar7 = m + straw >> 1;
                sVar2 = ttUSHORT(psVar10 + (long)(iVar7 * 4) + 2);
                if (glyph2 < (int)(uint)sVar2) {
                  straw = iVar7 + -1;
                }
                else {
                  if (glyph2 <= (int)(uint)sVar2) {
                    sVar5 = ttSHORT(psVar10 + (long)(iVar7 * 4) + 2 + 2);
                    return (int)sVar5;
                  }
                  m = iVar7 + 1;
                }
              }
            }
          }
        }
      }
    }
  }
  return 0;
}

Assistant:

static stbtt_int32 stbtt__GetGlyphGPOSInfoAdvance(const stbtt_fontinfo *info, int glyph1, int glyph2)
{
   stbtt_uint16 lookupListOffset;
   stbtt_uint8 *lookupList;
   stbtt_uint16 lookupCount;
   stbtt_uint8 *data;
   stbtt_int32 i, sti;

   if (!info->gpos) return 0;

   data = info->data + info->gpos;

   if (ttUSHORT(data+0) != 1) return 0; // Major version 1
   if (ttUSHORT(data+2) != 0) return 0; // Minor version 0

   lookupListOffset = ttUSHORT(data+8);
   lookupList = data + lookupListOffset;
   lookupCount = ttUSHORT(lookupList);

   for (i=0; i<lookupCount; ++i) {
      stbtt_uint16 lookupOffset = ttUSHORT(lookupList + 2 + 2 * i);
      stbtt_uint8 *lookupTable = lookupList + lookupOffset;

      stbtt_uint16 lookupType = ttUSHORT(lookupTable);
      stbtt_uint16 subTableCount = ttUSHORT(lookupTable + 4);
      stbtt_uint8 *subTableOffsets = lookupTable + 6;
      if (lookupType != 2) // Pair Adjustment Positioning Subtable
         continue;

      for (sti=0; sti<subTableCount; sti++) {
         stbtt_uint16 subtableOffset = ttUSHORT(subTableOffsets + 2 * sti);
         stbtt_uint8 *table = lookupTable + subtableOffset;
         stbtt_uint16 posFormat = ttUSHORT(table);
         stbtt_uint16 coverageOffset = ttUSHORT(table + 2);
         stbtt_int32 coverageIndex = stbtt__GetCoverageIndex(table + coverageOffset, glyph1);
         if (coverageIndex == -1) continue;

         switch (posFormat) {
            case 1: {
               stbtt_int32 l, r, m;
               int straw, needle;
               stbtt_uint16 valueFormat1 = ttUSHORT(table + 4);
               stbtt_uint16 valueFormat2 = ttUSHORT(table + 6);
               if (valueFormat1 == 4 && valueFormat2 == 0) { // Support more formats?
                  stbtt_int32 valueRecordPairSizeInBytes = 2;
                  stbtt_uint16 pairSetCount = ttUSHORT(table + 8);
                  stbtt_uint16 pairPosOffset = ttUSHORT(table + 10 + 2 * coverageIndex);
                  stbtt_uint8 *pairValueTable = table + pairPosOffset;
                  stbtt_uint16 pairValueCount = ttUSHORT(pairValueTable);
                  stbtt_uint8 *pairValueArray = pairValueTable + 2;

                  if (coverageIndex >= pairSetCount) return 0;

                  needle=glyph2;
                  r=pairValueCount-1;
                  l=0;

                  // Binary search.
                  while (l <= r) {
                     stbtt_uint16 secondGlyph;
                     stbtt_uint8 *pairValue;
                     m = (l + r) >> 1;
                     pairValue = pairValueArray + (2 + valueRecordPairSizeInBytes) * m;
                     secondGlyph = ttUSHORT(pairValue);
                     straw = secondGlyph;
                     if (needle < straw)
                        r = m - 1;
                     else if (needle > straw)
                        l = m + 1;
                     else {
                        stbtt_int16 xAdvance = ttSHORT(pairValue + 2);
                        return xAdvance;
                     }
                  }
               } else
                  return 0;
               break;
            }

            case 2: {
               stbtt_uint16 valueFormat1 = ttUSHORT(table + 4);
               stbtt_uint16 valueFormat2 = ttUSHORT(table + 6);
               if (valueFormat1 == 4 && valueFormat2 == 0) { // Support more formats?
                  stbtt_uint16 classDef1Offset = ttUSHORT(table + 8);
                  stbtt_uint16 classDef2Offset = ttUSHORT(table + 10);
                  int glyph1class = stbtt__GetGlyphClass(table + classDef1Offset, glyph1);
                  int glyph2class = stbtt__GetGlyphClass(table + classDef2Offset, glyph2);

                  stbtt_uint16 class1Count = ttUSHORT(table + 12);
                  stbtt_uint16 class2Count = ttUSHORT(table + 14);
                  stbtt_uint8 *class1Records, *class2Records;
                  stbtt_int16 xAdvance;

                  if (glyph1class < 0 || glyph1class >= class1Count) return 0; // malformed
                  if (glyph2class < 0 || glyph2class >= class2Count) return 0; // malformed

                  class1Records = table + 16;
                  class2Records = class1Records + 2 * (glyph1class * class2Count);
                  xAdvance = ttSHORT(class2Records + 2 * glyph2class);
                  return xAdvance;
               } else
                  return 0;
               break;
            }

            default:
               return 0; // Unsupported position format
         }
      }
   }

   return 0;
}